

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plugin.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::compiler::Version::ByteSizeLong(Version *this)

{
  uint uVar1;
  int32_t iVar2;
  uint32_t *puVar3;
  string *value;
  size_t sVar4;
  size_t sStack_18;
  uint32_t cached_has_bits;
  size_t total_size;
  Version *this_local;
  
  sStack_18 = 0;
  puVar3 = internal::HasBits<1UL>::operator[](&this->_has_bits_,0);
  uVar1 = *puVar3;
  if ((uVar1 & 0xf) != 0) {
    if ((uVar1 & 1) != 0) {
      value = _internal_suffix_abi_cxx11_(this);
      sStack_18 = internal::WireFormatLite::StringSize(value);
      sStack_18 = sStack_18 + 1;
    }
    if ((uVar1 & 2) != 0) {
      iVar2 = _internal_major(this);
      sVar4 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_18 = sVar4 + sStack_18;
    }
    if ((uVar1 & 4) != 0) {
      iVar2 = _internal_minor(this);
      sVar4 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_18 = sVar4 + sStack_18;
    }
    if ((uVar1 & 8) != 0) {
      iVar2 = _internal_patch(this);
      sVar4 = internal::WireFormatLite::Int32SizePlusOne(iVar2);
      sStack_18 = sVar4 + sStack_18;
    }
  }
  sVar4 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_18,&this->_cached_size_);
  return sVar4;
}

Assistant:

size_t Version::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:google.protobuf.compiler.Version)
  size_t total_size = 0;

  uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  if (cached_has_bits & 0x0000000fu) {
    // optional string suffix = 4;
    if (cached_has_bits & 0x00000001u) {
      total_size += 1 +
        ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::StringSize(
          this->_internal_suffix());
    }

    // optional int32 major = 1;
    if (cached_has_bits & 0x00000002u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_major());
    }

    // optional int32 minor = 2;
    if (cached_has_bits & 0x00000004u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_minor());
    }

    // optional int32 patch = 3;
    if (cached_has_bits & 0x00000008u) {
      total_size += ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::Int32SizePlusOne(this->_internal_patch());
    }

  }
  return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);
}